

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

TimingControlStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::TimingControlStatementSyntax,slang::syntax::NamedLabelSyntax*&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::syntax::TimingControlSyntax&,slang::syntax::StatementSyntax&>
          (BumpAllocator *this,NamedLabelSyntax **args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,TimingControlSyntax *args_2,
          StatementSyntax *args_3)

{
  TimingControlStatementSyntax *this_00;
  
  this_00 = (TimingControlStatementSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((TimingControlStatementSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (TimingControlStatementSyntax *)allocateSlow(this,0x68,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  slang::syntax::StatementSyntax::StatementSyntax
            (&this_00->super_StatementSyntax,TimingControlStatement,*args,args_1);
  (this_00->timingControl).ptr = args_2;
  (this_00->statement).ptr = args_3;
  (args_2->super_SyntaxNode).parent = (SyntaxNode *)this_00;
  (args_3->super_SyntaxNode).parent = (SyntaxNode *)this_00;
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }